

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Aig_Man_t * Saig_ManCreateMiterTwo(Aig_Man_t *pOld,Aig_Man_t *pNew,int nFrames)

{
  Aig_Man_t *p0;
  Aig_Man_t *p1;
  Aig_Man_t *pAVar1;
  
  p0 = Saig_ManUnrollTwo(pOld,pOld,nFrames);
  p1 = Saig_ManUnrollTwo(pNew,pOld,nFrames);
  pAVar1 = Saig_ManCreateMiterComb(p0,p1,0);
  Aig_ManStop(p0);
  Aig_ManStop(p1);
  return pAVar1;
}

Assistant:

Aig_Man_t * Saig_ManCreateMiterTwo( Aig_Man_t * pOld, Aig_Man_t * pNew, int nFrames )
{
    Aig_Man_t * pFrames0, * pFrames1, * pMiter;
//    assert( Aig_ManNodeNum(pOld) <= Aig_ManNodeNum(pNew) );
    pFrames0 = Saig_ManUnrollTwo( pOld, pOld, nFrames );
    pFrames1 = Saig_ManUnrollTwo( pNew, pOld, nFrames );
    pMiter = Saig_ManCreateMiterComb( pFrames0, pFrames1, 0 );
    Aig_ManStop( pFrames0 );
    Aig_ManStop( pFrames1 );
    return pMiter;
}